

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

void __thiscall
SList<void_*,_Memory::ArenaAllocator,_RealCount>::Clear
          (SList<void_*,_Memory::ArenaAllocator,_RealCount> *this)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  SList<void_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  SList<void_*,_Memory::ArenaAllocator,_RealCount> *buffer;
  
  this_00 = &this->allocator->
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  buffer = (SList<void_*,_Memory::ArenaAllocator,_RealCount> *)
           (this->super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>).
           super_SListNodeBase<Memory::ArenaAllocator>.next;
  while (buffer != this) {
    pSVar1 = (SList<void_*,_Memory::ArenaAllocator,_RealCount> *)
             (buffer->super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>).
             super_SListNodeBase<Memory::ArenaAllocator>.next;
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (this_00,buffer,0x10);
    buffer = pSVar1;
  }
  (this->super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)this;
  (this->super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count = 0;
  return;
}

Assistant:

void Clear()
    {
        __super::Clear(allocator);
    }